

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryBuilder::readTags(WasmBinaryBuilder *this)

{
  Module *this_00;
  bool bVar1;
  uint32_t uVar2;
  ostream *this_01;
  void *this_02;
  Signature SVar3;
  Name name;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  Name local_40;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> local_30;
  uint32_t local_24;
  ulong uStack_20;
  uint32_t typeIndex;
  size_t i;
  size_t numTags;
  WasmBinaryBuilder *this_local;
  
  numTags = (size_t)this;
  bVar1 = isDebugEnabled("binary");
  if (bVar1) {
    std::operator<<((ostream *)&std::cerr,"== readTags\n");
  }
  uVar2 = getU32LEB(this);
  i = (size_t)uVar2;
  bVar1 = isDebugEnabled("binary");
  if (bVar1) {
    this_01 = std::operator<<((ostream *)&std::cerr,"num: ");
    this_02 = (void *)std::ostream::operator<<(this_01,i);
    std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
  }
  for (uStack_20 = 0; uStack_20 < i; uStack_20 = uStack_20 + 1) {
    bVar1 = isDebugEnabled("binary");
    if (bVar1) {
      std::operator<<((ostream *)&std::cerr,"read one\n");
    }
    getInt8(this);
    local_24 = getU32LEB(this);
    this_00 = this->wasm;
    std::__cxx11::to_string(&local_80,uStack_20);
    std::operator+(&local_60,"tag$",&local_80);
    wasm::Name::Name(&local_40,&local_60);
    SVar3 = getSignatureByTypeIndex(this,local_24);
    SVar3.results.id = SVar3.params.id.id;
    SVar3.params.id = (uintptr_t)local_40.super_IString.str._M_str;
    name.super_IString.str._M_str = (char *)local_40.super_IString.str._M_len;
    name.super_IString.str._M_len = (size_t)&local_30;
    Builder::makeTag(name,SVar3);
    Module::addTag(this_00,&local_30);
    std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::~unique_ptr(&local_30);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  return;
}

Assistant:

void WasmBinaryBuilder::readTags() {
  BYN_TRACE("== readTags\n");
  size_t numTags = getU32LEB();
  BYN_TRACE("num: " << numTags << std::endl);
  for (size_t i = 0; i < numTags; i++) {
    BYN_TRACE("read one\n");
    getInt8(); // Reserved 'attribute' field
    auto typeIndex = getU32LEB();
    wasm.addTag(Builder::makeTag("tag$" + std::to_string(i),
                                 getSignatureByTypeIndex(typeIndex)));
  }
}